

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

void test_response_callback_after_message_complete(void)

{
  cio_error cVar1;
  cio_inet_address *arg1;
  cio_http_location target;
  cio_http_server_configuration config;
  cio_http_server server;
  
  on_header_complete_fake.custom_fake = message_complete_write_response;
  memcpy(&config,&DAT_001199e0,0xb8);
  arg1 = cio_get_inet_address_any4();
  cio_init_inet_socket_address(&config.endpoint,arg1,0x1f90);
  cio_buffered_stream_write_fake.custom_fake = bs_write_blocks;
  header_complete_fake.custom_fake = callback_write_ok_response;
  cVar1 = cio_http_server_init(&server,&loop,&config);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Server initialization failed!",0x7b5,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_http_location_init(&target,"/foo",(void *)0x0,alloc_dummy_handler);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Request target initialization failed!",0x7b9,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_http_server_register_location(&server,&target);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Register request target failed!",0x7bb,UNITY_DISPLAY_STYLE_INT);
  split_request("GET /foo HTTP/1.1\r\nContent-Length: 0\r\n\r\n");
  cVar1 = cio_http_server_serve(&server);
  UnityAssertEqualNumber(0,(long)cVar1,"Serving http failed!",0x7c0,UNITY_DISPLAY_STYLE_INT);
  (*blocked_write_handler)(blocked_write_bs,blocked_write_handler_context,CIO_SUCCESS);
  check_http_response(200);
  UnityAssertEqualNumber
            (1,(ulong)cio_buffered_stream_close_fake.call_count,"buffered stream was not closed!",
             0x7c5,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_response_callback_after_message_complete(void)
{
	on_header_complete_fake.custom_fake = message_complete_write_response;

	struct cio_http_server_configuration config = {
	    .on_error = serve_error,
	    .read_header_timeout_ns = header_read_timeout,
	    .read_body_timeout_ns = body_read_timeout,
	    .response_timeout_ns = response_timeout,
	    .close_timeout_ns = 10,
	    .alloc_client = alloc_dummy_client,
	    .free_client = free_dummy_client};

	cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

	cio_buffered_stream_write_fake.custom_fake = bs_write_blocks;
	header_complete_fake.custom_fake = callback_write_ok_response;

	struct cio_http_server server;
	enum cio_error err = cio_http_server_init(&server, &loop, &config);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

	struct cio_http_location target;
	err = cio_http_location_init(&target, "/foo", NULL, alloc_dummy_handler);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");
	err = cio_http_server_register_location(&server, &target);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target failed!");

	split_request("GET /foo HTTP/1.1" CRLF "Content-Length: 0" CRLF CRLF);

	err = cio_http_server_serve(&server);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");

	blocked_write_handler(blocked_write_bs, blocked_write_handler_context, CIO_SUCCESS);
	check_http_response(200);

	TEST_ASSERT_EQUAL_MESSAGE(1, cio_buffered_stream_close_fake.call_count, "buffered stream was not closed!");
}